

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O1

void __thiscall rsg::ExecutionContext::~ExecutionContext(ExecutionContext *this)

{
  _Base_ptr p_Var1;
  void *pvVar2;
  pointer pEVar3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  
  for (p_Var4 = (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_varValues)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = p_Var4[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      pvVar2 = *(void **)p_Var1;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)p_Var1->_M_left - (long)pvVar2);
      }
      operator_delete(p_Var1,0x18);
    }
  }
  std::
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::clear((_Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
           *)this);
  pEVar3 = (this->m_execMaskStack).
           super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3,(long)(this->m_execMaskStack).
                                 super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3);
  }
  std::
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::~_Rb_tree((_Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
               *)this);
  return;
}

Assistant:

ExecutionContext::~ExecutionContext (void)
{
	for (VarValueMap::iterator i = m_varValues.begin(); i != m_varValues.end(); i++)
		delete i->second;
	m_varValues.clear();
}